

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int get_sleb128(int32_t *pval,uint8_t *buf,uint8_t *buf_end)

{
  int iVar1;
  byte bVar2;
  uint8_t *ptr;
  uint8_t *puVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  bool bVar7;
  bool bVar8;
  
  uVar4 = 0;
  iVar6 = -1;
  if (buf < buf_end) {
    puVar3 = buf + 1;
    bVar2 = 0;
    uVar5 = 0;
    uVar4 = 0;
    do {
      uVar4 = (puVar3[-1] & 0x7f) << (bVar2 & 0x1f) | uVar4;
      if (-1 < (char)puVar3[-1]) {
        iVar6 = uVar5 + 1;
        goto LAB_0010dcce;
      }
      bVar7 = uVar5 < 4;
      uVar5 = uVar5 + 1;
      bVar8 = puVar3 < buf_end;
      bVar2 = bVar2 + 7;
      puVar3 = puVar3 + 1;
    } while (bVar8 && bVar7);
    uVar4 = 0;
  }
LAB_0010dcce:
  uVar4 = -(uVar4 & 1) ^ uVar4 >> 1;
  if (iVar6 < 0) {
    uVar4 = 0;
  }
  iVar1 = -1;
  if (iVar6 >= 0) {
    iVar1 = iVar6;
  }
  *pval = uVar4;
  return iVar1;
}

Assistant:

static int get_sleb128(int32_t *pval, const uint8_t *buf,
                       const uint8_t *buf_end)
{
    int ret;
    uint32_t val;
    ret = get_leb128(&val, buf, buf_end);
    if (ret < 0) {
        *pval = 0;
        return -1;
    }
    *pval = (val >> 1) ^ -(val & 1);
    return ret;
}